

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O0

void helper_booke206_tlbilx1_ppc(CPUPPCState_conflict *env,target_ulong_conflict address)

{
  uint uVar1;
  int iVar2;
  CPUState_conflict *cpu;
  ppc6xx_tlb_t_conflict *ppStack_28;
  int tlb_size;
  ppcmas_tlb_t *tlb;
  int tid;
  int j;
  int i;
  target_ulong_conflict address_local;
  CPUPPCState_conflict *env_local;
  
  uVar1 = env->spr[0x276];
  ppStack_28 = (env->tlb).tlb6;
  for (tid = 0; tid < 4; tid = tid + 1) {
    iVar2 = booke206_tlb_size(env,tid);
    for (tlb._4_4_ = 0; tlb._4_4_ < iVar2; tlb._4_4_ = tlb._4_4_ + 1) {
      if (((ppStack_28[(long)tlb._4_4_ * 2].pte1 & 0x40000000) == 0) &&
         ((ppStack_28[(long)tlb._4_4_ * 2].pte1 & 0x3fff0000) == (uVar1 & 0x3fff0000))) {
        ppStack_28[(long)tlb._4_4_ * 2].pte1 = ppStack_28[(long)tlb._4_4_ * 2].pte1 & 0x7fffffff;
      }
    }
    iVar2 = booke206_tlb_size(env,tid);
    ppStack_28 = ppStack_28 + (long)iVar2 * 2;
  }
  cpu = env_cpu(env);
  tlb_flush_ppc(cpu);
  return;
}

Assistant:

void helper_booke206_tlbilx1(CPUPPCState *env, target_ulong address)
{
    int i, j;
    int tid = (env->spr[SPR_BOOKE_MAS6] & MAS6_SPID);
    ppcmas_tlb_t *tlb = env->tlb.tlbm;
    int tlb_size;

    /* XXX missing LPID handling */
    for (i = 0; i < BOOKE206_MAX_TLBN; i++) {
        tlb_size = booke206_tlb_size(env, i);
        for (j = 0; j < tlb_size; j++) {
            if (!(tlb[j].mas1 & MAS1_IPROT) &&
                ((tlb[j].mas1 & MAS1_TID_MASK) == tid)) {
                tlb[j].mas1 &= ~MAS1_VALID;
            }
        }
        tlb += booke206_tlb_size(env, i);
    }
    tlb_flush(env_cpu(env));
}